

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::BlenderModifier_Mirror::DoIt
          (BlenderModifier_Mirror *this,aiNode *out,ConversionData *conv_data,
          ElemBase *orig_modifier,Scene *param_4,Object *orig_object)

{
  TempArray<std::vector,_aiMesh> *this_00;
  pointer *pppaVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  _func_int **pp_Var5;
  aiVector3D *paVar6;
  uint *puVar7;
  iterator __position;
  long lVar8;
  uint *__dest;
  Logger *this_01;
  size_t sVar9;
  ulong uVar10;
  aiFace *paVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  uint uVar20;
  uint uVar21;
  aiMesh *mesh;
  long *local_1c8;
  long local_1b8 [2];
  aiMesh *local_1a8 [14];
  ios_base local_138 [264];
  
  if (*(int *)&orig_modifier[4]._vptr_ElemBase != 5) {
    __assert_fail("mir.modifier.type == ModifierData::eModifierType_Mirror",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderModifier.cpp"
                  ,0xa4,
                  "virtual void Assimp::Blender::BlenderModifier_Mirror::DoIt(aiNode &, ConversionData &, const ElemBase &, const Scene &, const Object &)"
                 );
  }
  this_00 = &conv_data->meshes;
  ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            (&this_00->arr,
             (ulong)out->mNumMeshes +
             ((long)(conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3));
  uVar10 = (ulong)out->mNumMeshes;
  if (out->mNumMeshes != 0) {
    uVar13 = 0;
    do {
      SceneCombiner::Copy(local_1a8,
                          (this_00->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[out->mMeshes[uVar13]]);
      pcVar14 = orig_modifier[6].dna_type;
      fVar19 = 1.0;
      fVar17 = 1.0;
      if (((ulong)pcVar14 & 0x80000) != 0) {
        fVar17 = -1.0;
      }
      fVar18 = 1.0;
      if (((ulong)pcVar14 & 0x100000) != 0) {
        fVar18 = -1.0;
      }
      if (((ulong)pcVar14 & 0x200000) != 0) {
        fVar19 = -1.0;
      }
      pp_Var5 = orig_modifier[7]._vptr_ElemBase;
      if (pp_Var5 == (_func_int **)0x0) {
        if (local_1a8[0]->mNumVertices != 0) {
          lVar8 = 8;
          uVar10 = 0;
          do {
            paVar6 = local_1a8[0]->mVertices;
            *(float *)((long)paVar6 + lVar8 + -8) = *(float *)((long)paVar6 + lVar8 + -8) * fVar17;
            *(float *)((long)paVar6 + lVar8 + -4) = *(float *)((long)paVar6 + lVar8 + -4) * fVar18;
            *(float *)((long)&paVar6->x + lVar8) = *(float *)((long)&paVar6->x + lVar8) * fVar19;
            uVar10 = uVar10 + 1;
            lVar8 = lVar8 + 0xc;
          } while (uVar10 < local_1a8[0]->mNumVertices);
        }
      }
      else if (local_1a8[0]->mNumVertices != 0) {
        fVar2 = *(float *)((long)pp_Var5 + 0x45c);
        fVar3 = *(float *)(pp_Var5 + 0x8c);
        fVar4 = *(float *)((long)pp_Var5 + 0x464);
        lVar8 = 8;
        uVar10 = 0;
        do {
          paVar6 = local_1a8[0]->mVertices;
          *(float *)((long)paVar6 + lVar8 + -8) =
               (fVar2 - *(float *)((long)paVar6 + lVar8 + -8)) * fVar17 + fVar2;
          *(float *)((long)paVar6 + lVar8 + -4) =
               (fVar3 - *(float *)((long)paVar6 + lVar8 + -4)) * fVar18 + fVar3;
          *(float *)((long)&paVar6->x + lVar8) =
               (fVar4 - *(float *)((long)&paVar6->x + lVar8)) * fVar19 + fVar4;
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0xc;
        } while (uVar10 < local_1a8[0]->mNumVertices);
      }
      if ((local_1a8[0]->mNormals != (aiVector3D *)0x0) && (local_1a8[0]->mNumVertices != 0)) {
        lVar8 = 8;
        uVar10 = 0;
        do {
          paVar6 = local_1a8[0]->mNormals;
          *(float *)((long)paVar6 + lVar8 + -8) = *(float *)((long)paVar6 + lVar8 + -8) * fVar17;
          *(float *)((long)paVar6 + lVar8 + -4) = *(float *)((long)paVar6 + lVar8 + -4) * fVar18;
          *(float *)((long)&paVar6->x + lVar8) = *(float *)((long)&paVar6->x + lVar8) * fVar19;
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0xc;
        } while (uVar10 < local_1a8[0]->mNumVertices);
      }
      if ((local_1a8[0]->mTangents != (aiVector3D *)0x0) && (local_1a8[0]->mNumVertices != 0)) {
        lVar8 = 8;
        uVar10 = 0;
        do {
          paVar6 = local_1a8[0]->mTangents;
          *(float *)((long)paVar6 + lVar8 + -8) = *(float *)((long)paVar6 + lVar8 + -8) * fVar17;
          *(float *)((long)paVar6 + lVar8 + -4) = *(float *)((long)paVar6 + lVar8 + -4) * fVar18;
          *(float *)((long)&paVar6->x + lVar8) = *(float *)((long)&paVar6->x + lVar8) * fVar19;
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0xc;
        } while (uVar10 < local_1a8[0]->mNumVertices);
      }
      if ((local_1a8[0]->mBitangents != (aiVector3D *)0x0) && (local_1a8[0]->mNumVertices != 0)) {
        lVar8 = 8;
        uVar10 = 0;
        do {
          paVar6 = local_1a8[0]->mBitangents;
          *(float *)((long)paVar6 + lVar8 + -8) = *(float *)((long)paVar6 + lVar8 + -8) * fVar17;
          *(float *)((long)paVar6 + lVar8 + -4) = *(float *)((long)paVar6 + lVar8 + -4) * fVar18;
          *(float *)((long)&paVar6->x + lVar8) = *(float *)((long)&paVar6->x + lVar8) * fVar19;
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0xc;
        } while (uVar10 < local_1a8[0]->mNumVertices);
      }
      pcVar14 = orig_modifier[6].dna_type;
      lVar8 = 0;
      do {
        if ((local_1a8[0]->mTextureCoords[lVar8] == (aiVector3D *)0x0) ||
           (local_1a8[0]->mNumVertices == 0)) break;
        if (local_1a8[0]->mNumVertices != 0) {
          lVar12 = 4;
          uVar10 = 0;
          do {
            paVar6 = local_1a8[0]->mTextureCoords[lVar8];
            uVar20 = *(uint *)((long)paVar6 + lVar12 + -4);
            if (((ulong)pcVar14 & 0x20000) != 0) {
              uVar20 = uVar20 ^ 0x80000000;
            }
            uVar21 = *(uint *)((long)&paVar6->x + lVar12);
            *(uint *)((long)paVar6 + lVar12 + -4) = uVar20;
            if (((ulong)pcVar14 & 0x40000) != 0) {
              uVar21 = uVar21 ^ 0x80000000;
            }
            *(uint *)((long)&paVar6->x + lVar12) = uVar21;
            uVar10 = uVar10 + 1;
            lVar12 = lVar12 + 0xc;
          } while (uVar10 < local_1a8[0]->mNumVertices);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      if ((fVar19 * fVar17 * fVar18 < 0.0) && (local_1a8[0]->mNumFaces != 0)) {
        uVar10 = 0;
        do {
          uVar20 = local_1a8[0]->mFaces[uVar10].mNumIndices;
          if (1 < uVar20) {
            paVar11 = local_1a8[0]->mFaces + uVar10;
            iVar15 = -1;
            uVar16 = 0;
            do {
              puVar7 = paVar11->mIndices;
              uVar21 = puVar7[uVar16];
              puVar7[uVar16] = puVar7[uVar20 + iVar15];
              puVar7[uVar20 + iVar15] = uVar21;
              uVar16 = uVar16 + 1;
              uVar20 = paVar11->mNumIndices;
              iVar15 = iVar15 + -1;
            } while (uVar16 < uVar20 >> 1);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < local_1a8[0]->mNumFaces);
      }
      __position._M_current =
           (conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                  ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,__position,local_1a8);
      }
      else {
        *__position._M_current = local_1a8[0];
        pppaVar1 = &(conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      uVar13 = uVar13 + 1;
      uVar10 = (ulong)out->mNumMeshes;
    } while (uVar13 < uVar10);
  }
  iVar15 = (int)uVar10;
  __dest = (uint *)operator_new__((ulong)(uint)(iVar15 * 2) << 2);
  puVar7 = out->mMeshes;
  if (iVar15 != 0) {
    memmove(__dest,puVar7,uVar10 * 4);
    lVar8 = 0;
    do {
      *(int *)((long)__dest + lVar8 + uVar10 * 4) = *(int *)((long)puVar7 + lVar8) + iVar15;
      lVar8 = lVar8 + 4;
    } while (uVar10 * 4 - lVar8 != 0);
  }
  if (puVar7 != (uint *)0x0) {
    operator_delete__(puVar7);
  }
  out->mMeshes = __dest;
  out->mNumMeshes = out->mNumMeshes << 1;
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[50]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [50])"BlendModifier: Applied the `Mirror` modifier to `");
  pcVar14 = (orig_object->id).name;
  sVar9 = strlen(pcVar14);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar9);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"`",1);
  ::std::__cxx11::stringbuf::str();
  Logger::info(this_01,(char *)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void  BlenderModifier_Mirror :: DoIt(aiNode& out, ConversionData& conv_data,  const ElemBase& orig_modifier,
    const Scene& /*in*/,
    const Object& orig_object )
{
    // hijacking the ABI, see the big note in BlenderModifierShowcase::ApplyModifiers()
    const MirrorModifierData& mir = static_cast<const MirrorModifierData&>(orig_modifier);
    ai_assert(mir.modifier.type == ModifierData::eModifierType_Mirror);

    conv_data.meshes->reserve(conv_data.meshes->size() + out.mNumMeshes);

    // XXX not entirely correct, mirroring on two axes results in 4 distinct objects in blender ...

    // take all input meshes and clone them
    for (unsigned int i = 0; i < out.mNumMeshes; ++i) {
        aiMesh* mesh;
        SceneCombiner::Copy(&mesh,conv_data.meshes[out.mMeshes[i]]);

        const float xs = mir.flag & MirrorModifierData::Flags_AXIS_X ? -1.f : 1.f;
        const float ys = mir.flag & MirrorModifierData::Flags_AXIS_Y ? -1.f : 1.f;
        const float zs = mir.flag & MirrorModifierData::Flags_AXIS_Z ? -1.f : 1.f;

        if (mir.mirror_ob) {
            const aiVector3D center( mir.mirror_ob->obmat[3][0],mir.mirror_ob->obmat[3][1],mir.mirror_ob->obmat[3][2] );
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];

                v.x = center.x + xs*(center.x - v.x);
                v.y = center.y + ys*(center.y - v.y);
                v.z = center.z + zs*(center.z - v.z);
            }
        }
        else {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mNormals) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mNormals[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mTangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mBitangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mBitangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        const float us = mir.flag & MirrorModifierData::Flags_MIRROR_U ? -1.f : 1.f;
        const float vs = mir.flag & MirrorModifierData::Flags_MIRROR_V ? -1.f : 1.f;

        for (unsigned int n = 0; mesh->HasTextureCoords(n); ++n) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTextureCoords[n][i];
                v.x *= us;v.y *= vs;
            }
        }

        // Only reverse the winding order if an odd number of axes were mirrored.
        if (xs * ys * zs < 0) {
            for( unsigned int i = 0; i < mesh->mNumFaces; i++) {
                aiFace& face = mesh->mFaces[i];
                for( unsigned int fi = 0; fi < face.mNumIndices / 2; ++fi)
                    std::swap( face.mIndices[fi], face.mIndices[face.mNumIndices - 1 - fi]);
            }
        }

        conv_data.meshes->push_back(mesh);
    }
    unsigned int* nind = new unsigned int[out.mNumMeshes*2];

    std::copy(out.mMeshes,out.mMeshes+out.mNumMeshes,nind);
    std::transform(out.mMeshes,out.mMeshes+out.mNumMeshes,nind+out.mNumMeshes,
        [&out](unsigned int n) { return out.mNumMeshes + n; });

    delete[] out.mMeshes;
    out.mMeshes = nind;
    out.mNumMeshes *= 2;

    ASSIMP_LOG_INFO_F("BlendModifier: Applied the `Mirror` modifier to `",
        orig_object.id.name,"`");
}